

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::anon_unknown_14::translateActiveException(void)

{
  pointer ppIVar1;
  int iVar2;
  undefined8 uVar3;
  long *plVar4;
  char *pcVar5;
  undefined8 *puVar6;
  String *in_RDI;
  IExceptionTranslator **curr;
  pointer ppIVar7;
  undefined1 auVar8 [12];
  String res;
  String local_40;
  
  String::String(&local_40);
  getExceptionTranslators();
  ppIVar1 = getExceptionTranslators::data.
            super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (getExceptionTranslators::data.
      super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      getExceptionTranslators::data.
      super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppIVar7 = getExceptionTranslators::data.
              super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar2 = (*(*ppIVar7)->_vptr_IExceptionTranslator[2])(*ppIVar7,&local_40);
      if ((char)iVar2 != '\0') {
        String::String(in_RDI,&local_40);
        if ((char)iVar2 != '\0') goto LAB_00109beb;
      }
      ppIVar7 = ppIVar7 + 1;
    } while (ppIVar7 != ppIVar1);
  }
  auVar8 = __cxa_rethrow();
  iVar2 = auVar8._8_4_;
  uVar3 = auVar8._0_8_;
  if (iVar2 == 4) {
    plVar4 = (long *)__cxa_begin_catch(uVar3);
    pcVar5 = (char *)(**(code **)(*plVar4 + 0x10))(plVar4);
    String::String(in_RDI,pcVar5);
    __cxa_end_catch();
  }
  else if (iVar2 == 3) {
    puVar6 = (undefined8 *)__cxa_begin_catch(uVar3);
    String::String(in_RDI,(char *)*puVar6);
    __cxa_end_catch();
  }
  else {
    pcVar5 = (char *)__cxa_begin_catch(uVar3);
    if (iVar2 == 2) {
      String::String(in_RDI,pcVar5);
      __cxa_end_catch();
    }
    else {
      String::String(in_RDI,"unknown exception");
      __cxa_end_catch();
    }
  }
LAB_00109beb:
  String::~String(&local_40);
  return in_RDI;
}

Assistant:

String translateActiveException() {
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
        String res;
        auto&  translators = getExceptionTranslators();
        for(auto& curr : translators)
            if(curr->translate(res))
                return res;
        // clang-format off
        DOCTEST_GCC_SUPPRESS_WARNING_WITH_PUSH("-Wcatch-value")
        try {
            throw;
        } catch(std::exception& ex) {
            return ex.what();
        } catch(std::string& msg) {
            return msg.c_str();
        } catch(const char* msg) {
            return msg;
        } catch(...) {
            return "unknown exception";
        }
        DOCTEST_GCC_SUPPRESS_WARNING_POP
// clang-format on
#else  // DOCTEST_CONFIG_NO_EXCEPTIONS
        return "";
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
    }